

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O1

libcaption_stauts_t caption_frame_carriage_return(caption_frame_t *frame)

{
  caption_frame_buffer_t *pcVar1;
  int iVar2;
  uint uVar3;
  libcaption_stauts_t lVar4;
  uint uVar5;
  caption_frame_cell_t (*pacVar6) [32];
  caption_frame_cell_t (*__dest) [32];
  long lVar7;
  ulong uVar8;
  
  lVar4 = LIBCAPTION_ERROR;
  uVar3 = (uint)(byte)(frame->state).row;
  if (uVar3 < 0xf) {
    lVar4 = LIBCAPTION_OK;
    uVar5 = *(uint *)&frame->state >> 4 & 3;
    if (uVar5 != 0) {
      iVar2 = uVar3 + 1;
      uVar3 = iVar2 - uVar5;
      if (0 < (int)uVar3) {
        if ((int)uVar3 < 0xf) {
          uVar8 = (ulong)uVar3;
          uVar3 = ~uVar5 + iVar2;
          lVar7 = uVar8 << 8;
          do {
            pcVar1 = frame->write;
            __dest = pcVar1->cell + uVar3;
            pacVar6 = (caption_frame_cell_t (*) [32])(pcVar1->cell[0][0].data + lVar7 + -1);
            if (pcVar1 == (caption_frame_buffer_t *)0x0) {
              pacVar6 = (caption_frame_cell_t (*) [32])0x0;
              __dest = (caption_frame_cell_t (*) [32])0x0;
            }
            if (0xe < uVar3) {
              __dest = (caption_frame_cell_t (*) [32])0x0;
            }
            if (0xe < uVar8) {
              pacVar6 = (caption_frame_cell_t (*) [32])0x0;
            }
            memcpy(__dest,pacVar6,0x100);
            uVar8 = uVar8 + 1;
            uVar3 = uVar3 + 1;
            lVar7 = lVar7 + 0x100;
          } while ((int)uVar3 < 0xe);
        }
        (frame->state).col = '\0';
        pacVar6 = frame->write->cell + 0xe;
        if (frame->write == (caption_frame_buffer_t *)0x0) {
          pacVar6 = (caption_frame_cell_t (*) [32])0x0;
        }
        memset(pacVar6,0,0x100);
      }
    }
  }
  return lVar4;
}

Assistant:

libcaption_stauts_t caption_frame_carriage_return(caption_frame_t* frame)
{
    if (0 > frame->state.row || SCREEN_ROWS <= frame->state.row) {
        return LIBCAPTION_ERROR;
    }

    int r = frame->state.row - (frame->state.rup - 1);

    if (0 >= r || !caption_frame_rollup(frame)) {
        return LIBCAPTION_OK;
    }

    for (; r < SCREEN_ROWS; ++r) {
        uint8_t* dst = (uint8_t*)frame_buffer_cell(frame->write, r - 1, 0);
        uint8_t* src = (uint8_t*)frame_buffer_cell(frame->write, r - 0, 0);
        memcpy(dst, src, sizeof(caption_frame_cell_t) * SCREEN_COLS);
    }

    frame->state.col = 0;
    caption_frame_cell_t* cell = frame_buffer_cell(frame->write, SCREEN_ROWS - 1, 0);
    memset(cell, 0, sizeof(caption_frame_cell_t) * SCREEN_COLS);
    return LIBCAPTION_OK;
}